

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void hor_boundary_overlap
               (int *top_block,int top_stride,int *bottom_block,int bottom_stride,int *dst_block,
               int dst_stride,int width,int height)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int *local_28;
  int *local_18;
  int *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((int)dst_block == 1) {
    for (; in_stack_00000008 != 0; in_stack_00000008 = in_stack_00000008 + -1) {
      iVar1 = clamp(*local_8 * 0x17 + *local_18 * 0x16 + 0x10 >> 5,grain_min,grain_max);
      *local_28 = iVar1;
      local_8 = local_8 + 1;
      local_18 = local_18 + 1;
      local_28 = local_28 + 1;
    }
  }
  else if ((int)dst_block == 2) {
    for (; in_stack_00000008 != 0; in_stack_00000008 = in_stack_00000008 + -1) {
      iVar1 = clamp(*local_8 * 0x1b + *local_18 * 0x11 + 0x10 >> 5,grain_min,grain_max);
      *local_28 = iVar1;
      iVar1 = clamp(local_8[in_ESI] * 0x11 + local_18[in_ECX] * 0x1b + 0x10 >> 5,grain_min,grain_max
                   );
      local_28[in_R9D] = iVar1;
      local_8 = local_8 + 1;
      local_18 = local_18 + 1;
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

static void hor_boundary_overlap(int *top_block, int top_stride,
                                 int *bottom_block, int bottom_stride,
                                 int *dst_block, int dst_stride, int width,
                                 int height) {
  if (height == 1) {
    while (width) {
      *dst_block = clamp((*top_block * 23 + *bottom_block * 22 + 16) >> 5,
                         grain_min, grain_max);
      ++top_block;
      ++bottom_block;
      ++dst_block;
      --width;
    }
    return;
  } else if (height == 2) {
    while (width) {
      dst_block[0] = clamp((27 * top_block[0] + 17 * bottom_block[0] + 16) >> 5,
                           grain_min, grain_max);
      dst_block[dst_stride] = clamp((17 * top_block[top_stride] +
                                     27 * bottom_block[bottom_stride] + 16) >>
                                        5,
                                    grain_min, grain_max);
      ++top_block;
      ++bottom_block;
      ++dst_block;
      --width;
    }
    return;
  }
}